

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O0

void __thiscall
TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *box_lower,
          vector<double,_std::allocator<double>_> *box_upper,function<double_()> *get_random01)

{
  size_type sVar1;
  double *box_lower_00;
  double *box_upper_00;
  function<double_()> local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  function<double_()> *local_28;
  function<double_()> *get_random01_local;
  vector<double,_std::allocator<double>_> *box_upper_local;
  vector<double,_std::allocator<double>_> *box_lower_local;
  ParticleSwarmState *this_local;
  
  local_28 = get_random01;
  get_random01_local = (function<double_()> *)box_upper;
  box_upper_local = box_lower;
  box_lower_local = (vector<double,_std::allocator<double>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"ParticleSwarmState::initializeParticlesInsideBox",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"box lower bounds",&local_81);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(box_upper_local);
  checkVarSize(&local_48,&local_80,(int)sVar1,this->num_dimensions);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"ParticleSwarmState::initializeParticlesInsideBox",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"box upper bounds",&local_d1);
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)get_random01_local);
  checkVarSize(&local_a8,&local_d0,(int)sVar1,this->num_dimensions);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  box_lower_00 = std::vector<double,_std::allocator<double>_>::data(box_upper_local);
  box_upper_00 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)get_random01_local);
  std::function<double_()>::function(&local_f8,get_random01);
  initializeParticlesInsideBox(this,box_lower_00,box_upper_00,&local_f8);
  std::function<double_()>::~function(&local_f8);
  return;
}

Assistant:

void ParticleSwarmState::initializeParticlesInsideBox(const std::vector<double> &box_lower, const std::vector<double> &box_upper,
                                                      const std::function<double(void)> get_random01) {
    checkVarSize("ParticleSwarmState::initializeParticlesInsideBox", "box lower bounds", box_lower.size(), num_dimensions);
    checkVarSize("ParticleSwarmState::initializeParticlesInsideBox", "box upper bounds", box_upper.size(), num_dimensions);
    ParticleSwarmState::initializeParticlesInsideBox(box_lower.data(), box_upper.data(), get_random01);
}